

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STLExtras.h
# Opt level: O2

bool llvm::is_contained<llvm::SmallPtrSet<llvm::cl::SubCommand*,4u>&,llvm::cl::SubCommand*>
               (SmallPtrSet<llvm::cl::SubCommand_*,_4U> *Range,SubCommand **Element)

{
  iterator iVar1;
  iterator iVar2;
  SmallPtrSetIterator<llvm::cl::SubCommand_*> SVar3;
  
  iVar1 = SmallPtrSetImpl<llvm::cl::SubCommand_*>::begin
                    (&Range->super_SmallPtrSetImpl<llvm::cl::SubCommand_*>);
  iVar2 = SmallPtrSetImpl<llvm::cl::SubCommand_*>::end
                    (&Range->super_SmallPtrSetImpl<llvm::cl::SubCommand_*>);
  SVar3 = std::
          __find_if<llvm::SmallPtrSetIterator<llvm::cl::SubCommand*>,__gnu_cxx::__ops::_Iter_equals_val<llvm::cl::SubCommand*const>>
                    (iVar1.super_SmallPtrSetIteratorImpl.Bucket,
                     iVar1.super_SmallPtrSetIteratorImpl.End,
                     iVar2.super_SmallPtrSetIteratorImpl.Bucket,
                     iVar2.super_SmallPtrSetIteratorImpl.End,Element);
  iVar1 = SmallPtrSetImpl<llvm::cl::SubCommand_*>::end
                    (&Range->super_SmallPtrSetImpl<llvm::cl::SubCommand_*>);
  return SVar3.super_SmallPtrSetIteratorImpl.Bucket != iVar1.super_SmallPtrSetIteratorImpl.Bucket;
}

Assistant:

bool is_contained(R &&Range, const E &Element) {
  return std::find(adl_begin(Range), adl_end(Range), Element) != adl_end(Range);
}